

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

void HTS_Model_get_index(HTS_Model *model,size_t state_index,char *string,size_t *tree_index,
                        size_t *pdf_index)

{
  size_t *psVar1;
  HTS_Boolean HVar2;
  size_t sVar3;
  undefined8 *puVar4;
  HTS_Model *pHVar5;
  HTS_Model *pHVar6;
  
  *tree_index = 2;
  *pdf_index = 1;
  pHVar5 = model;
  if (model != (HTS_Model *)0x0) {
    do {
      if (pHVar5->ntree == state_index) {
        puVar4 = (undefined8 *)pHVar5->vector_length;
        pHVar6 = pHVar5;
        if (puVar4 == (undefined8 *)0x0) break;
        do {
          HVar2 = HTS_pattern_match(string,(char *)*puVar4);
          if (HVar2 != '\0') goto LAB_00155891;
          puVar4 = (undefined8 *)puVar4[1];
        } while (puVar4 != (undefined8 *)0x0);
      }
      *tree_index = *tree_index + 1;
      psVar1 = &pHVar5->num_windows;
      pHVar6 = model;
      pHVar5 = (HTS_Model *)*psVar1;
    } while ((HTS_Model *)*psVar1 != (HTS_Model *)0x0);
LAB_00155891:
    sVar3 = HTS_Tree_search_node(*(HTS_Tree **)&pHVar6->is_msd,string);
    *pdf_index = sVar3;
  }
  return;
}

Assistant:

static void HTS_Model_get_index(HTS_Model * model, size_t state_index, const char *string, size_t * tree_index, size_t * pdf_index)
{
   HTS_Tree *tree;
   HTS_Pattern *pattern;
   HTS_Boolean find;

   (*tree_index) = 2;
   (*pdf_index) = 1;

   if (model->tree == NULL)
      return;

   find = FALSE;
   for (tree = model->tree; tree; tree = tree->next) {
      if (tree->state == state_index) {
         pattern = tree->head;
         if (!pattern)
            find = TRUE;
         for (; pattern; pattern = pattern->next)
            if (HTS_pattern_match(string, pattern->string)) {
               find = TRUE;
               break;
            }
         if (find)
            break;
      }
      (*tree_index)++;
   }

   if (tree != NULL) {
      (*pdf_index) = HTS_Tree_search_node(tree, string);
   } else {
      (*pdf_index) = HTS_Tree_search_node(model->tree, string);
   }
}